

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimplifyGlobals.cpp
# Opt level: O2

bool __thiscall wasm::SimplifyGlobals::removeUnneededWrites(SimplifyGlobals *this)

{
  __int_type_conflict1 _Var1;
  __int_type_conflict1 _Var2;
  pointer puVar3;
  undefined8 uVar4;
  mapped_type *pmVar5;
  bool bVar6;
  pointer puVar7;
  WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::GlobalSetRemover,_wasm::Visitor<wasm::(anonymous_namespace)::GlobalSetRemover,_void>_>_>
  local_1b8;
  undefined1 *local_88;
  undefined1 local_80;
  undefined1 local_7f;
  undefined1 local_78 [8];
  NameSet globalsNotNeedingSets;
  
  globalsNotNeedingSets._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)&globalsNotNeedingSets;
  globalsNotNeedingSets._M_t._M_impl._0_4_ = 0;
  globalsNotNeedingSets._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  globalsNotNeedingSets._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  globalsNotNeedingSets._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  puVar7 = (this->module->globals).
           super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar3 = (this->module->globals).
           super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  bVar6 = false;
  globalsNotNeedingSets._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       globalsNotNeedingSets._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  globalsNotNeedingSets._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)this;
  do {
    if (puVar7 == puVar3) {
      local_80 = *(undefined1 *)
                  (globalsNotNeedingSets._M_t._M_impl.super__Rb_tree_header._M_node_count + 0x90);
      local_1b8.super_Pass.name._M_dataplus._M_p = (pointer)&local_1b8.super_Pass.name.field_2;
      local_1b8.super_Pass.runner = (PassRunner *)0x0;
      local_1b8.super_Pass.name._M_string_length = 0;
      local_1b8.super_Pass.name.field_2._M_local_buf[0] = '\0';
      local_1b8.super_Pass.passArg.
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._M_engaged = false;
      local_1b8.
      super_PostWalker<wasm::(anonymous_namespace)::GlobalSetRemover,_wasm::Visitor<wasm::(anonymous_namespace)::GlobalSetRemover,_void>_>
      .
      super_Walker<wasm::(anonymous_namespace)::GlobalSetRemover,_wasm::Visitor<wasm::(anonymous_namespace)::GlobalSetRemover,_void>_>
      .replacep = (Expression **)0x0;
      local_1b8.
      super_PostWalker<wasm::(anonymous_namespace)::GlobalSetRemover,_wasm::Visitor<wasm::(anonymous_namespace)::GlobalSetRemover,_void>_>
      .
      super_Walker<wasm::(anonymous_namespace)::GlobalSetRemover,_wasm::Visitor<wasm::(anonymous_namespace)::GlobalSetRemover,_void>_>
      .stack.usedFixed = 0;
      local_1b8.
      super_PostWalker<wasm::(anonymous_namespace)::GlobalSetRemover,_wasm::Visitor<wasm::(anonymous_namespace)::GlobalSetRemover,_void>_>
      .
      super_Walker<wasm::(anonymous_namespace)::GlobalSetRemover,_wasm::Visitor<wasm::(anonymous_namespace)::GlobalSetRemover,_void>_>
      .stack.flexible.
      super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::GlobalSetRemover,_wasm::Visitor<wasm::(anonymous_namespace)::GlobalSetRemover,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::GlobalSetRemover,_wasm::Visitor<wasm::(anonymous_namespace)::GlobalSetRemover,_void>_>::Task>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_1b8.
      super_PostWalker<wasm::(anonymous_namespace)::GlobalSetRemover,_wasm::Visitor<wasm::(anonymous_namespace)::GlobalSetRemover,_void>_>
      .
      super_Walker<wasm::(anonymous_namespace)::GlobalSetRemover,_wasm::Visitor<wasm::(anonymous_namespace)::GlobalSetRemover,_void>_>
      .stack.flexible.
      super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::GlobalSetRemover,_wasm::Visitor<wasm::(anonymous_namespace)::GlobalSetRemover,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::GlobalSetRemover,_wasm::Visitor<wasm::(anonymous_namespace)::GlobalSetRemover,_void>_>::Task>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_1b8.
      super_PostWalker<wasm::(anonymous_namespace)::GlobalSetRemover,_wasm::Visitor<wasm::(anonymous_namespace)::GlobalSetRemover,_void>_>
      .
      super_Walker<wasm::(anonymous_namespace)::GlobalSetRemover,_wasm::Visitor<wasm::(anonymous_namespace)::GlobalSetRemover,_void>_>
      .currModule = (Module *)0x0;
      local_1b8.
      super_PostWalker<wasm::(anonymous_namespace)::GlobalSetRemover,_wasm::Visitor<wasm::(anonymous_namespace)::GlobalSetRemover,_void>_>
      .
      super_Walker<wasm::(anonymous_namespace)::GlobalSetRemover,_wasm::Visitor<wasm::(anonymous_namespace)::GlobalSetRemover,_void>_>
      .stack.flexible.
      super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::GlobalSetRemover,_wasm::Visitor<wasm::(anonymous_namespace)::GlobalSetRemover,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::GlobalSetRemover,_wasm::Visitor<wasm::(anonymous_namespace)::GlobalSetRemover,_void>_>::Task>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_1b8.
      super_PostWalker<wasm::(anonymous_namespace)::GlobalSetRemover,_wasm::Visitor<wasm::(anonymous_namespace)::GlobalSetRemover,_void>_>
      .
      super_Walker<wasm::(anonymous_namespace)::GlobalSetRemover,_wasm::Visitor<wasm::(anonymous_namespace)::GlobalSetRemover,_void>_>
      .currFunction = (Function *)0x0;
      local_1b8.super_Pass._vptr_Pass = (_func_int **)&PTR__WalkerPass_011258c0;
      local_88 = local_78;
      local_7f = 0;
      uVar4 = *(undefined8 *)
               (globalsNotNeedingSets._M_t._M_impl.super__Rb_tree_header._M_node_count + 0x58);
      Pass::setPassRunner(&local_1b8.super_Pass,
                          *(PassRunner **)
                           (globalsNotNeedingSets._M_t._M_impl.super__Rb_tree_header._M_node_count +
                           8));
      (*local_1b8.super_Pass._vptr_Pass[2])(&local_1b8,uVar4);
      WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::GlobalSetRemover,_wasm::Visitor<wasm::(anonymous_namespace)::GlobalSetRemover,_void>_>_>
      ::~WalkerPass(&local_1b8);
      std::
      _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
      ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                   *)local_78);
      return bVar6;
    }
    pmVar5 = std::
             map<wasm::Name,_wasm::(anonymous_namespace)::GlobalInfo,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::(anonymous_namespace)::GlobalInfo>_>_>
             ::operator[](&this->map,
                          (key_type *)
                          (puVar7->_M_t).
                          super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>.
                          _M_t.
                          super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>
                          .super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl);
    if ((((pmVar5->written).super___atomic_base<unsigned_int>._M_i != 0) &&
        (pmVar5->imported == false)) && (pmVar5->exported == false)) {
      _Var1 = (pmVar5->read).super___atomic_base<unsigned_int>._M_i;
      _Var2 = (pmVar5->readOnlyToWrite).super___atomic_base<unsigned_int>._M_i;
      if ((pmVar5->written).super___atomic_base<unsigned_int>._M_i <
          (pmVar5->readOnlyToWrite).super___atomic_base<unsigned_int>._M_i) {
        __assert_fail("info.written >= info.readOnlyToWrite",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/SimplifyGlobals.cpp"
                      ,0x241,"bool wasm::SimplifyGlobals::removeUnneededWrites()");
      }
      if ((((pmVar5->read).super___atomic_base<unsigned_int>._M_i == 0) || (_Var1 == _Var2)) ||
         (((pmVar5->nonInitWritten)._M_base._M_i & 1U) == 0)) {
        std::
        _Rb_tree<wasm::Name,wasm::Name,std::_Identity<wasm::Name>,std::less<wasm::Name>,std::allocator<wasm::Name>>
        ::_M_insert_unique<wasm::Name_const&>
                  ((_Rb_tree<wasm::Name,wasm::Name,std::_Identity<wasm::Name>,std::less<wasm::Name>,std::allocator<wasm::Name>>
                    *)local_78,
                   (Name *)(puVar7->_M_t).
                           super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>.
                           _M_t.
                           super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>
                           .super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl);
        ((puVar7->_M_t).super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>._M_t
         .super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
         super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl)->mutable_ = false;
        LOCK();
        (pmVar5->written).super___atomic_base<unsigned_int>._M_i = 0;
        UNLOCK();
        bVar6 = (bool)(bVar6 | _Var1 == _Var2);
      }
    }
    puVar7 = puVar7 + 1;
  } while( true );
}

Assistant:

bool removeUnneededWrites() {
    bool more = false;

    // Globals that are not exports and not read from do not need their sets.
    // Likewise, globals that only write their initial value later also do not
    // need those writes. And, globals that are only read from in order to write
    // to themselves as well. First, find such globals.
    NameSet globalsNotNeedingSets;
    for (auto& global : module->globals) {
      auto& info = map[global->name];

      if (!info.written) {
        // No writes occur here, so there is nothing for us to remove.
        continue;
      }

      if (info.imported || info.exported) {
        // If the global is observable from the outside, we can't do anythng
        // here.
        //
        // TODO: optimize the case of an imported but immutable global, etc.
        continue;
      }

      // We only ever optimize read-only-to-write if all of our reads are done
      // in places we identified as read-only-to-write. That is, we have
      // eliminated the possibility of any other uses. (Technically, each
      // read-to-write location might have more than one read since we did not
      // count them, but only verified there was one read or more; but this is
      // good enough as the common case has exactly one.)
      //
      // Note that there might be more writes, if there are additional writes
      // besides those in the read-only-to-write locations. But we can ignore
      // those, as whatever they write will not be read in order to do anything
      // of value.
      bool onlyReadOnlyToWrite = (info.read == info.readOnlyToWrite);

      // There is at least one write in each read-only-to-write location, unless
      // our logic is wrong somewhere.
      assert(info.written >= info.readOnlyToWrite);

      if (!info.read || !info.nonInitWritten || onlyReadOnlyToWrite) {
        globalsNotNeedingSets.insert(global->name);

        // We can now mark this global as immutable, and un-written, since we
        // are about to remove all the sets on it.
        global->mutable_ = false;
        info.written = 0;

        // Nested only-read-to-write expressions require another full iteration
        // to optimize, as we have:
        //
        //   if (a) {
        //     a = 1;
        //     if (b) {
        //       b = 1;
        //     }
        //   }
        //
        // The first iteration can only optimize b, as the outer if's body has
        // more effects than we understand. After finishing the first iteration,
        // b will no longer exist, removing those effects.
        //
        // TODO: In principle other situations exist as well where more
        //       iterations help, like if we remove a set that turns something
        //       into a read-only-to-write.
        if (onlyReadOnlyToWrite) {
          more = true;
        }
      }
    }

    // Remove all the sets on the unnecessary globals. Later optimizations can
    // then see that since the global has no writes, it is a constant, which
    // will lead to removal of gets, and after removing them, the global itself
    // will be removed as well.
    GlobalSetRemover(&globalsNotNeedingSets, optimize)
      .run(getPassRunner(), module);

    return more;
  }